

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Stream_New(FT_Library library,FT_Open_Args *args,FT_Stream *astream)

{
  uint uVar1;
  FT_Memory pFVar2;
  unsigned_long uVar3;
  FT_Stream stream;
  FT_Error FVar4;
  
  *astream = (FT_Stream)0x0;
  if (library == (FT_Library)0x0) {
    FVar4 = 0x21;
  }
  else if (args == (FT_Open_Args *)0x0) {
    FVar4 = 6;
  }
  else {
    pFVar2 = library->memory;
    stream = (FT_Stream)(*pFVar2->alloc)(pFVar2,0x50);
    FVar4 = (uint)(stream == (FT_Stream)0x0) << 6;
    if (stream != (FT_Stream)0x0) {
      stream->close = (FT_Stream_CloseFunc)0x0;
      stream->memory = (FT_Memory)0x0;
      stream->cursor = (uchar *)0x0;
      stream->limit = (uchar *)0x0;
      (stream->pathname).value = 0;
      stream->read = (FT_Stream_IoFunc)0x0;
      stream->pos = 0;
      (stream->descriptor).value = 0;
      stream->base = (uchar *)0x0;
      stream->size = 0;
      stream->memory = pFVar2;
      uVar1 = args->flags;
      if ((uVar1 & 1) == 0) {
        if ((uVar1 & 4) == 0) {
          if (((uVar1 & 2) == 0) || (args->stream == (FT_Stream)0x0)) {
            FVar4 = 6;
          }
          else {
            if (stream != (FT_Stream)0x0) {
              (*pFVar2->free)(pFVar2,stream);
            }
            stream = args->stream;
          }
        }
        else {
          FVar4 = FT_Stream_Open(stream,args->pathname);
          stream->pathname = (FT_StreamDesc)args->pathname;
        }
      }
      else {
        uVar3 = args->memory_size;
        stream->base = args->memory_base;
        stream->size = uVar3;
        stream->pos = 0;
        stream->cursor = (uchar *)0x0;
        stream->read = (FT_Stream_IoFunc)0x0;
        stream->close = (FT_Stream_CloseFunc)0x0;
      }
      if (FVar4 == 0) {
        stream->memory = pFVar2;
      }
      else {
        if (stream != (FT_Stream)0x0) {
          (*pFVar2->free)(pFVar2,stream);
        }
        stream = (FT_Stream)0x0;
      }
      *astream = stream;
    }
  }
  return FVar4;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_New( FT_Library           library,
                 const FT_Open_Args*  args,
                 FT_Stream           *astream )
  {
    FT_Error   error;
    FT_Memory  memory;
    FT_Stream  stream = NULL;


    *astream = NULL;

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !args )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    if ( FT_NEW( stream ) )
      goto Exit;

    stream->memory = memory;

    if ( args->flags & FT_OPEN_MEMORY )
    {
      /* create a memory-based stream */
      FT_Stream_OpenMemory( stream,
                            (const FT_Byte*)args->memory_base,
                            (FT_ULong)args->memory_size );
    }

#ifndef FT_CONFIG_OPTION_DISABLE_STREAM_SUPPORT

    else if ( args->flags & FT_OPEN_PATHNAME )
    {
      /* create a normal system stream */
      error = FT_Stream_Open( stream, args->pathname );
      stream->pathname.pointer = args->pathname;
    }
    else if ( ( args->flags & FT_OPEN_STREAM ) && args->stream )
    {
      /* use an existing, user-provided stream */

      /* in this case, we do not need to allocate a new stream object */
      /* since the caller is responsible for closing it himself       */
      FT_FREE( stream );
      stream = args->stream;
    }

#endif

    else
      error = FT_THROW( Invalid_Argument );

    if ( error )
      FT_FREE( stream );
    else
      stream->memory = memory;  /* just to be certain */

    *astream = stream;

  Exit:
    return error;
  }